

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O1

void __thiscall util_tests::test_script_parsing::test_method(test_script_parsing *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  readonly_property65 rVar7;
  bool bVar8;
  int iVar9;
  iterator pvVar10;
  iterator in_R9;
  iterator pvVar11;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  Span<const_char> SVar12;
  string_view separators;
  string_view separators_00;
  string_view separators_01;
  string_view separators_02;
  check_type cVar13;
  undefined1 *local_740;
  undefined1 *local_738;
  char *local_730;
  char *local_728;
  undefined1 *local_720;
  undefined1 *local_718;
  char *local_710;
  char *local_708;
  undefined1 *local_700;
  undefined1 *local_6f8;
  char *local_6f0;
  char *local_6e8;
  undefined1 *local_6e0;
  undefined1 *local_6d8;
  char *local_6d0;
  char *local_6c8;
  undefined1 *local_6c0;
  undefined1 *local_6b8;
  char *local_6b0;
  char *local_6a8;
  undefined1 *local_6a0;
  undefined1 *local_698;
  char *local_690;
  char *local_688;
  undefined1 *local_680;
  undefined1 *local_678;
  char *local_670;
  char *local_668;
  undefined1 *local_660;
  undefined1 *local_658;
  char *local_650;
  char *local_648;
  undefined1 *local_640;
  undefined1 *local_638;
  char *local_630;
  char *local_628;
  undefined1 *local_620;
  undefined1 *local_618;
  char *local_610;
  char *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  char *local_5f0;
  char *local_5e8;
  undefined1 *local_5e0;
  undefined1 *local_5d8;
  char *local_5d0;
  char *local_5c8;
  undefined1 *local_5c0;
  undefined1 *local_5b8;
  char *local_5b0;
  char *local_5a8;
  undefined1 *local_5a0;
  undefined1 *local_598;
  char *local_590;
  char *local_588;
  undefined1 *local_580;
  undefined1 *local_578;
  char *local_570;
  char *local_568;
  undefined1 local_55c [20];
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  undefined1 *local_498;
  undefined1 *local_490;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  undefined1 local_178 [16];
  undefined1 *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  Span<const_char> local_108;
  char *local_f0;
  assertion_result local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  char **local_c0;
  char *local_b8;
  assertion_result local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string input;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  input._M_dataplus._M_p = (pointer)&input.field_2;
  input._M_string_length = 0;
  input.field_2._M_local_buf[0] = '\0';
  local_108.m_data = (char *)0x0;
  local_108.m_size = 0;
  pvVar10 = (iterator)0xe;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&input,0,0,"MilkToastHoney",0xe);
  local_108.m_data = input._M_dataplus._M_p;
  local_108.m_size = input._M_string_length;
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"");
  rVar7.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)::script::Const((string *)local_58,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
  }
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar13 = 0x742af0;
  file.m_end = (iterator)0x524;
  file.m_begin = (iterator)&local_118;
  msg.m_end = in_R9;
  msg.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_128,msg);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar7.super_readonly_property<bool>.super_class_property<bool>.value;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_48._8_8_ = local_178;
  local_178._0_8_ = "success";
  local_178._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_130 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)local_58,1,0,WARN,_cVar13,(size_t)&local_138,0x524);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x525;
  file_00.m_begin = (iterator)&local_148;
  msg_00.m_end = pvVar11;
  msg_00.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_158,
             msg_00);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,local_108.m_data,local_108.m_data + local_108.m_size);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"MilkToastHoney");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf98108;
  local_b8 = "";
  local_48._8_8_ = &local_c8;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  local_f0 = "MilkToastHoney";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013d3e30;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_178,1,2,REQUIRE,0xf9ecef,(size_t)&local_c0,0x525,
             (lazy_ostream *)local_58,"\"MilkToastHoney\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Milk","");
  rVar7.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)::script::Const((string *)local_58,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar13 = 0x742dd7;
  file_01.m_end = (iterator)0x528;
  file_01.m_begin = (iterator)&local_188;
  msg_01.m_end = pvVar11;
  msg_01.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_198,
             msg_01);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar7.super_readonly_property<bool>.super_class_property<bool>.value;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_178._0_8_ = "success";
  local_178._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1a0 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_48._8_8_ = (lazy_ostream *)local_178;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)local_58,1,0,WARN,_cVar13,(size_t)&local_1a8,0x528);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x529;
  file_02.m_begin = (iterator)&local_1b8;
  msg_02.m_end = pvVar11;
  msg_02.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1c8,
             msg_02);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,local_108.m_data,local_108.m_data + local_108.m_size);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"ToastHoney");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf98108;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "ToastHoney";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013d5340;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_178,1,2,REQUIRE,0xf9ecef,(size_t)&local_c0,0x529,
             (lazy_ostream *)local_58,"\"ToastHoney\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Bread","");
  bVar8 = ::script::Const((string *)local_58,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar13 = 0x7430cf;
  file_03.m_end = (iterator)0x52c;
  file_03.m_begin = (iterator)&local_1d8;
  msg_03.m_end = pvVar11;
  msg_03.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1e8,
             msg_03);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar8;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_178._0_8_ = "!success";
  local_178._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1f0 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_48._8_8_ = (lazy_ostream *)local_178;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)local_58,1,0,WARN,_cVar13,(size_t)&local_1f8,0x52c);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Toast","");
  rVar7.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)::script::Const((string *)local_58,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_208 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar13 = 0x7431f3;
  file_04.m_end = (iterator)0x52f;
  file_04.m_begin = (iterator)&local_208;
  msg_04.m_end = pvVar11;
  msg_04.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_218,
             msg_04);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar7.super_readonly_property<bool>.super_class_property<bool>.value;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_178._0_8_ = "success";
  local_178._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_220 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_48._8_8_ = (lazy_ostream *)local_178;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)local_58,1,0,WARN,_cVar13,(size_t)&local_228,0x52f);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x530;
  file_05.m_begin = (iterator)&local_238;
  msg_05.m_end = pvVar11;
  msg_05.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_248,
             msg_05);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,local_108.m_data,local_108.m_data + local_108.m_size);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"Honey");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf98108;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "Honey";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013d4230;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_178,1,2,REQUIRE,0xf9ecef,(size_t)&local_c0,0x530,
             (lazy_ostream *)local_58,"\"Honey\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Honeybadger","");
  bVar8 = ::script::Const((string *)local_58,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar13 = 0x7434ee;
  file_06.m_end = (iterator)0x533;
  file_06.m_begin = (iterator)&local_258;
  msg_06.m_end = pvVar11;
  msg_06.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_268,
             msg_06);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar8;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_178._0_8_ = "!success";
  local_178._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_270 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_48._8_8_ = (lazy_ostream *)local_178;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)local_58,1,0,WARN,_cVar13,(size_t)&local_278,0x533);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Honey","");
  rVar7.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)::script::Const((string *)local_58,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar13 = 0x743612;
  file_07.m_end = (iterator)0x536;
  file_07.m_begin = (iterator)&local_288;
  msg_07.m_end = pvVar11;
  msg_07.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_298,
             msg_07);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar7.super_readonly_property<bool>.super_class_property<bool>.value;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_178._0_8_ = "success";
  local_178._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_2a0 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_48._8_8_ = (lazy_ostream *)local_178;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)local_58,1,0,WARN,_cVar13,(size_t)&local_2a8,0x536);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x537;
  file_08.m_begin = (iterator)&local_2b8;
  msg_08.m_end = pvVar11;
  msg_08.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_2c8,
             msg_08);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,local_108.m_data,local_108.m_data + local_108.m_size);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf98108;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013d42f0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_178,1,2,REQUIRE,0xf9ecef,(size_t)&local_c0,0x537,
             (lazy_ostream *)local_58,"\"\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  pvVar11 = (iterator)0x10;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&input,0,input._M_string_length,"Foo(Bar(xy,z()))",0x10);
  local_108.m_data = input._M_dataplus._M_p;
  local_108.m_size = input._M_string_length;
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"FooBar","");
  bVar8 = ::script::Func((string *)local_58,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar13 = 0x743936;
  file_09.m_end = (iterator)0x53e;
  file_09.m_begin = (iterator)&local_2d8;
  msg_09.m_end = pvVar10;
  msg_09.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_2e8,
             msg_09);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar8;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_178._0_8_ = "!success";
  local_178._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_2f0 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_48._8_8_ = (lazy_ostream *)local_178;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)local_58,1,0,WARN,_cVar13,(size_t)&local_2f8,0x53e);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Foo(","");
  bVar8 = ::script::Func((string *)local_58,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_300 = "";
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar13 = 0x743a5a;
  file_10.m_end = (iterator)0x541;
  file_10.m_begin = (iterator)&local_308;
  msg_10.m_end = pvVar11;
  msg_10.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_318,
             msg_10);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar8;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_178._0_8_ = "!success";
  local_178._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_320 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_48._8_8_ = (lazy_ostream *)local_178;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)local_58,1,0,WARN,_cVar13,(size_t)&local_328,0x541);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Foo","");
  rVar7.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)::script::Func((string *)local_58,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_338 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_330 = "";
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar13 = 0x743b7e;
  file_11.m_end = (iterator)0x544;
  file_11.m_begin = (iterator)&local_338;
  msg_11.m_end = pvVar11;
  msg_11.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_348,
             msg_11);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar7.super_readonly_property<bool>.super_class_property<bool>.value;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_178._0_8_ = "success";
  local_178._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_350 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_48._8_8_ = (lazy_ostream *)local_178;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)local_58,1,0,WARN,_cVar13,(size_t)&local_358,0x544);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_360 = "";
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x545;
  file_12.m_begin = (iterator)&local_368;
  msg_12.m_end = pvVar11;
  msg_12.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_378,
             msg_12);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,local_108.m_data,local_108.m_data + local_108.m_size);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"Bar(xy,z())");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf98108;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "Bar(xy,z())";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013d5540;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_178,1,2,REQUIRE,0xf9ecef,(size_t)&local_c0,0x545,
             (lazy_ostream *)local_58,"\"Bar(xy,z())\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Bar","");
  rVar7.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)::script::Func((string *)local_58,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar13 = 0x743e81;
  file_13.m_end = (iterator)0x548;
  file_13.m_begin = (iterator)&local_388;
  msg_13.m_end = pvVar11;
  msg_13.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_398,
             msg_13);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar7.super_readonly_property<bool>.super_class_property<bool>.value;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_178._0_8_ = "success";
  local_178._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_3a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_3a0 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_48._8_8_ = (lazy_ostream *)local_178;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)local_58,1,0,WARN,_cVar13,(size_t)&local_3a8,0x548);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_3b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x549;
  file_14.m_begin = (iterator)&local_3b8;
  msg_14.m_end = pvVar11;
  msg_14.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_3c8,
             msg_14);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,local_108.m_data,local_108.m_data + local_108.m_size);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"xy,z()");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf98108;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "xy,z()";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013d3db0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_178,1,2,REQUIRE,0xf9ecef,(size_t)&local_c0,0x549,
             (lazy_ostream *)local_58,"\"xy,z()\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"xy","");
  bVar8 = ::script::Func((string *)local_58,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_3d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar13 = 0x744177;
  file_15.m_end = (iterator)0x54c;
  file_15.m_begin = (iterator)&local_3d8;
  msg_15.m_end = pvVar11;
  msg_15.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_3e8,
             msg_15);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar8;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_178._0_8_ = "!success";
  local_178._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_3f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_3f0 = "";
  pvVar11 = (iterator)0x0;
  local_48._8_8_ = (lazy_ostream *)local_178;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)local_58,1,0,WARN,_cVar13,(size_t)&local_3f8,0x54c);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  pvVar10 = (iterator)0xb;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&input,0,input._M_string_length,"(n*(n-1))/2",0xb);
  local_108.m_data = input._M_dataplus._M_p;
  local_108.m_size = input._M_string_length;
  SVar12 = ::script::Expr(&local_108);
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x554;
  file_16.m_begin = (iterator)&local_408;
  msg_16.m_end = pvVar11;
  msg_16.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_418,
             msg_16);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,SVar12.m_data,SVar12.m_data + SVar12.m_size);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"(n*(n-1))/2");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf98108;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "(n*(n-1))/2";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013d5540;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_178,1,2,REQUIRE,0xf9ed93,(size_t)&local_c0,0x554,
             (lazy_ostream *)local_58,"\"(n*(n-1))/2\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  paVar1 = &local_98.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x555;
  file_17.m_begin = (iterator)&local_428;
  msg_17.m_end = pvVar11;
  msg_17.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_438,
             msg_17);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,local_108.m_data,local_108.m_data + local_108.m_size);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf98108;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013d42f0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_178,1,2,REQUIRE,0xf9ecef,(size_t)&local_c0,0x555,
             (lazy_ostream *)local_58,"\"\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  pvVar11 = (iterator)0x7;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&input,0,input._M_string_length,"foo,bar",7);
  local_108.m_data = input._M_dataplus._M_p;
  local_108.m_size = input._M_string_length;
  SVar12 = ::script::Expr(&local_108);
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x55a;
  file_18.m_begin = (iterator)&local_448;
  msg_18.m_end = pvVar10;
  msg_18.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_458,
             msg_18);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,SVar12.m_data,SVar12.m_data + SVar12.m_size);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"foo");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf98108;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "foo";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013d44b0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_178,1,2,REQUIRE,0xf9ed93,(size_t)&local_c0,0x55a,
             (lazy_ostream *)local_58,"\"foo\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_468 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_460 = "";
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x55b;
  file_19.m_begin = (iterator)&local_468;
  msg_19.m_end = pvVar11;
  msg_19.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_478,
             msg_19);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,local_108.m_data,local_108.m_data + local_108.m_size);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,",bar");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf98108;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = ",bar";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013d45b0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_178,1,2,REQUIRE,0xf9ecef,(size_t)&local_c0,0x55b,
             (lazy_ostream *)local_58,"\",bar\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  pvVar11 = (iterator)0x11;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&input,0,input._M_string_length,"(aaaaa,bbbbb()),c",0x11);
  local_108.m_data = input._M_dataplus._M_p;
  local_108.m_size = input._M_string_length;
  SVar12 = ::script::Expr(&local_108);
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_480 = "";
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x560;
  file_20.m_begin = (iterator)&local_488;
  msg_20.m_end = pvVar10;
  msg_20.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_498,
             msg_20);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,SVar12.m_data,SVar12.m_data + SVar12.m_size);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"(aaaaa,bbbbb())");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf98108;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "(aaaaa,bbbbb())";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013d5500;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_178,1,2,REQUIRE,0xf9ed93,(size_t)&local_c0,0x560,
             (lazy_ostream *)local_58,"\"(aaaaa,bbbbb())\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_4a0 = "";
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x561;
  file_21.m_begin = (iterator)&local_4a8;
  msg_21.m_end = pvVar11;
  msg_21.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_4b8,
             msg_21);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,local_108.m_data,local_108.m_data + local_108.m_size);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,",c");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf98108;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = ",c";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013d5440;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_178,1,2,REQUIRE,0xf9ecef,(size_t)&local_c0,0x561,
             (lazy_ostream *)local_58,"\",c\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  pvVar11 = (iterator)0x7;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&input,0,input._M_string_length,"xyz)foo",7);
  local_108.m_data = input._M_dataplus._M_p;
  local_108.m_size = input._M_string_length;
  SVar12 = ::script::Expr(&local_108);
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_4c0 = "";
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x566;
  file_22.m_begin = (iterator)&local_4c8;
  msg_22.m_end = pvVar10;
  msg_22.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_4d8,
             msg_22);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,SVar12.m_data,SVar12.m_data + SVar12.m_size);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"xyz");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf98108;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "xyz";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013d44b0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_178,1,2,REQUIRE,0xf9ed93,(size_t)&local_c0,0x566,
             (lazy_ostream *)local_58,"\"xyz\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_4e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_4e0 = "";
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x567;
  file_23.m_begin = (iterator)&local_4e8;
  msg_23.m_end = pvVar11;
  msg_23.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_4f8,
             msg_23);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,local_108.m_data,local_108.m_data + local_108.m_size);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,")foo");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf98108;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = ")foo";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013d45b0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_178,1,2,REQUIRE,0xf9ecef,(size_t)&local_c0,0x567,
             (lazy_ostream *)local_58,"\")foo\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  pvVar11 = (iterator)0x11;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&input,0,input._M_string_length,"((a),(b),(c)),xxx",0x11);
  local_108.m_data = input._M_dataplus._M_p;
  local_108.m_size = input._M_string_length;
  SVar12 = ::script::Expr(&local_108);
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_500 = "";
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x56c;
  file_24.m_begin = (iterator)&local_508;
  msg_24.m_end = pvVar10;
  msg_24.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_518,
             msg_24);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,SVar12.m_data,SVar12.m_data + SVar12.m_size);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"((a),(b),(c))");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf98108;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "((a),(b),(c))";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013d7290;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_178,1,2,REQUIRE,0xf9ed93,(size_t)&local_c0,0x56c,
             (lazy_ostream *)local_58,"\"((a),(b),(c))\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_528 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_520 = "";
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x56d;
  file_25.m_begin = (iterator)&local_528;
  msg_25.m_end = pvVar11;
  msg_25.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_538,
             msg_25);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,local_108.m_data,local_108.m_data + local_108.m_size);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,",xxx");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf98108;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = ",xxx";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013d45b0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_178,1,2,REQUIRE,0xf9ecef,(size_t)&local_c0,0x56d,
             (lazy_ostream *)local_58,"\",xxx\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  pvVar11 = (iterator)0x3;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&input,0,input._M_string_length,"xxx",3);
  local_e8._0_8_ = input._M_dataplus._M_p;
  local_e8.m_message.px = (element_type *)input._M_string_length;
  local_178[0] = 0x78;
  separators._M_str = pvVar11;
  separators._M_len = (size_t)local_178;
  util::Split<Span<char_const>>
            ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)local_58,
             (util *)&local_e8,(Span<const_char> *)0x1,separators);
  uVar5 = local_48._M_allocated_capacity;
  uVar3 = local_58._8_8_;
  uVar2 = local_58._0_8_;
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_540 = "";
  local_55c._4_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_55c._12_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0x574;
  file_26.m_begin = (iterator)&local_548;
  msg_26.m_end = pvVar10;
  msg_26.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)(local_55c + 4),
             msg_26);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_f0 = (char *)((long)(uVar3 - uVar2) >> 4);
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_55c;
  local_55c._0_4_ = 4;
  local_98._M_dataplus._M_p._0_1_ = uVar3 - uVar2 == 0x40;
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  local_b0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b0.m_message.px = (element_type *)0xf98164;
  local_c0 = &local_f0;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3cf0;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013d3d30;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = &local_c8;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_48._8_8_ = &local_c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_98,(lazy_ostream *)local_178,1,2,REQUIRE,0xe97b94,
             (size_t)&local_b0,0x574,local_58,"4U",(util *)&local_e8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_98.field_2._M_allocated_capacity);
  local_570 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_568 = "";
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0x575;
  file_27.m_begin = (iterator)&local_570;
  msg_27.m_end = pvVar11;
  msg_27.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_580,
             msg_27);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,*(undefined **)uVar2,
             *(undefined **)(uVar2 + 8) + (long)*(undefined **)uVar2);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf98108;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013d42f0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_178,1,2,REQUIRE,0xf9ee47,(size_t)&local_c0,0x575,
             local_58,"\"\"",(util *)&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_590 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_588 = "";
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0x576;
  file_28.m_begin = (iterator)&local_590;
  msg_28.m_end = pvVar11;
  msg_28.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_5a0,
             msg_28);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,*(undefined **)(uVar2 + 0x10),
             *(undefined **)(uVar2 + 0x18) + (long)*(undefined **)(uVar2 + 0x10));
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf98108;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013d42f0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_178,1,2,REQUIRE,0xf9ee5d,(size_t)&local_c0,0x576,
             local_58,"\"\"",(util *)&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_5a8 = "";
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0x577;
  file_29.m_begin = (iterator)&local_5b0;
  msg_29.m_end = pvVar11;
  msg_29.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_5c0,
             msg_29);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,*(undefined **)(uVar2 + 0x20),
             *(undefined **)(uVar2 + 0x28) + (long)*(undefined **)(uVar2 + 0x20));
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf98108;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013d42f0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_178,1,2,REQUIRE,0xf9ee73,(size_t)&local_c0,0x577,
             local_58,"\"\"",(util *)&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_5d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_5c8 = "";
  local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0x578;
  file_30.m_begin = (iterator)&local_5d0;
  msg_30.m_end = pvVar11;
  msg_30.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_5e0,
             msg_30);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,*(undefined **)(uVar2 + 0x30),
             *(undefined **)(uVar2 + 0x38) + (long)*(undefined **)(uVar2 + 0x30));
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf98108;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013d42f0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_178,1,2,REQUIRE,0xf9ee89,(size_t)&local_c0,0x578,
             local_58,"\"\"",(util *)&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  pvVar11 = (iterator)0xd;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&input,0,input._M_string_length,"one#two#three",0xd);
  local_e8._0_8_ = input._M_dataplus._M_p;
  local_e8.m_message.px = (element_type *)input._M_string_length;
  local_178[0] = 0x2d;
  separators_00._M_str = pvVar11;
  separators_00._M_len = (size_t)local_178;
  util::Split<Span<char_const>>
            ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)local_58,
             (util *)&local_e8,(Span<const_char> *)0x1,separators_00);
  uVar6 = local_48._M_allocated_capacity;
  uVar4 = local_58._8_8_;
  uVar3 = local_58._0_8_;
  local_58._0_8_ = (pointer)0x0;
  local_58._8_8_ = (pointer)0x0;
  local_48._M_allocated_capacity = 0;
  operator_delete((void *)uVar2,uVar5 - uVar2);
  if ((pointer)local_58._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity - local_58._0_8_);
  }
  local_5f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_5e8 = "";
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_31.m_end = (iterator)0x57c;
  file_31.m_begin = (iterator)&local_5f0;
  msg_31.m_end = pvVar10;
  msg_31.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_600,
             msg_31);
  local_f0 = (char *)((long)(uVar4 - uVar3) >> 4);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3cf0;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_98._M_dataplus._M_p._0_1_ = uVar4 - uVar3 == 0x10;
  local_55c._0_4_ = 1;
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_b0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b0.m_message.px = (element_type *)0xf98164;
  local_c0 = &local_f0;
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_55c;
  local_e8._0_8_ = &PTR__lazy_ostream_013d3d30;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = &local_c8;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_48._8_8_ = &local_c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_98,(lazy_ostream *)local_178,1,2,REQUIRE,0xe97b94,
             (size_t)&local_b0,0x57c,local_58,"1U",&local_e8);
  paVar1 = &local_98.field_2;
  boost::detail::shared_count::~shared_count((shared_count *)&paVar1->_M_allocated_capacity);
  local_610 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_608 = "";
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  local_618 = &boost::unit_test::basic_cstring<char_const>::null;
  file_32.m_end = (iterator)0x57d;
  file_32.m_begin = (iterator)&local_610;
  msg_32.m_end = pvVar11;
  msg_32.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_620,
             msg_32);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,*(undefined **)uVar3,
             *(undefined **)(uVar3 + 8) + (long)*(undefined **)uVar3);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"one#two#three");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf98108;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "one#two#three";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013d7290;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_178,1,2,REQUIRE,0xf9ee47,(size_t)&local_c0,0x57d,
             local_58,"\"one#two#three\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  pvVar11 = (iterator)0xd;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&input,0,input._M_string_length,"one#two#three",0xd);
  local_e8._0_8_ = input._M_dataplus._M_p;
  local_e8.m_message.px = (element_type *)input._M_string_length;
  local_178[0] = 0x23;
  separators_01._M_str = pvVar11;
  separators_01._M_len = (size_t)local_178;
  util::Split<Span<char_const>>
            ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)local_58,
             (util *)&local_e8,(Span<const_char> *)0x1,separators_01);
  uVar4 = local_48._M_allocated_capacity;
  uVar5 = local_58._8_8_;
  uVar2 = local_58._0_8_;
  local_58._0_8_ = (pointer)0x0;
  local_58._8_8_ = (pointer)0x0;
  local_48._M_allocated_capacity = 0;
  operator_delete((void *)uVar3,uVar6 - uVar3);
  if ((pointer)local_58._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity - local_58._0_8_);
  }
  local_630 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_628 = "";
  local_640 = &boost::unit_test::basic_cstring<char_const>::null;
  local_638 = &boost::unit_test::basic_cstring<char_const>::null;
  file_33.m_end = (iterator)0x581;
  file_33.m_begin = (iterator)&local_630;
  msg_33.m_end = pvVar10;
  msg_33.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_640,
             msg_33);
  local_f0 = (char *)((long)(uVar5 - uVar2) >> 4);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3cf0;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_98._M_dataplus._M_p._0_1_ = uVar5 - uVar2 == 0x30;
  local_55c._0_4_ = 3;
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_b0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b0.m_message.px = (element_type *)0xf98164;
  local_c0 = &local_f0;
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_55c;
  local_e8._0_8_ = &PTR__lazy_ostream_013d3d30;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = &local_c8;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_48._8_8_ = &local_c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_98,(lazy_ostream *)local_178,1,2,REQUIRE,0xe97b94,
             (size_t)&local_b0,0x581,local_58,"3U",&local_e8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_98.field_2._M_allocated_capacity);
  local_650 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_648 = "";
  local_660 = &boost::unit_test::basic_cstring<char_const>::null;
  local_658 = &boost::unit_test::basic_cstring<char_const>::null;
  file_34.m_end = (iterator)0x582;
  file_34.m_begin = (iterator)&local_650;
  msg_34.m_end = pvVar11;
  msg_34.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_660,
             msg_34);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,*(undefined **)uVar2,
             *(undefined **)(uVar2 + 8) + (long)*(undefined **)uVar2);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"one");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf98108;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "one";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013d44b0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_178,1,2,REQUIRE,0xf9ee47,(size_t)&local_c0,0x582,
             local_58,"\"one\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_670 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_668 = "";
  local_680 = &boost::unit_test::basic_cstring<char_const>::null;
  local_678 = &boost::unit_test::basic_cstring<char_const>::null;
  file_35.m_end = (iterator)0x583;
  file_35.m_begin = (iterator)&local_670;
  msg_35.m_end = pvVar11;
  msg_35.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_680,
             msg_35);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,*(undefined **)(uVar2 + 0x10),
             *(undefined **)(uVar2 + 0x18) + (long)*(undefined **)(uVar2 + 0x10));
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"two");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf98108;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "two";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013d44b0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_178,1,2,REQUIRE,0xf9ee5d,(size_t)&local_c0,0x583,
             local_58,"\"two\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_690 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_688 = "";
  local_6a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_698 = &boost::unit_test::basic_cstring<char_const>::null;
  file_36.m_end = (iterator)0x584;
  file_36.m_begin = (iterator)&local_690;
  msg_36.m_end = pvVar11;
  msg_36.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_6a0,
             msg_36);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,*(undefined **)(uVar2 + 0x20),
             *(undefined **)(uVar2 + 0x28) + (long)*(undefined **)(uVar2 + 0x20));
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"three");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf98108;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "three";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013d4230;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_178,1,2,REQUIRE,0xf9ee73,(size_t)&local_c0,0x584,
             local_58,"\"three\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  pvVar11 = (iterator)0x9;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&input,0,input._M_string_length,"*foo*bar*",9);
  local_e8._0_8_ = input._M_dataplus._M_p;
  local_e8.m_message.px = (element_type *)input._M_string_length;
  local_178[0] = 0x2a;
  separators_02._M_str = pvVar11;
  separators_02._M_len = (size_t)local_178;
  util::Split<Span<char_const>>
            ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)local_58,
             (util *)&local_e8,(Span<const_char> *)0x1,separators_02);
  uVar6 = local_48._M_allocated_capacity;
  uVar5 = local_58._8_8_;
  uVar3 = local_58._0_8_;
  local_58._0_8_ = (pointer)0x0;
  local_58._8_8_ = (pointer)0x0;
  local_48._M_allocated_capacity = 0;
  operator_delete((void *)uVar2,uVar4 - uVar2);
  if ((pointer)local_58._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity - local_58._0_8_);
  }
  local_6b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_6a8 = "";
  local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_37.m_end = (iterator)0x588;
  file_37.m_begin = (iterator)&local_6b0;
  msg_37.m_end = pvVar10;
  msg_37.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_6c0,
             msg_37);
  local_f0 = (char *)((long)(uVar5 - uVar3) >> 4);
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3cf0;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_55c;
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_55c._0_4_ = 4;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_98._M_dataplus._M_p._0_1_ = uVar5 - uVar3 == 0x40;
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  local_e8._0_8_ = &PTR__lazy_ostream_013d3d30;
  local_b0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b0.m_message.px = (element_type *)0xf98164;
  local_c0 = &local_f0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = &local_c8;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_48._8_8_ = &local_c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_98,(lazy_ostream *)local_178,1,2,REQUIRE,0xe97b94,
             (size_t)&local_b0,0x588,local_58,"4U",&local_e8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_98.field_2._M_allocated_capacity);
  local_6d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_6c8 = "";
  local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_38.m_end = (iterator)0x589;
  file_38.m_begin = (iterator)&local_6d0;
  msg_38.m_end = pvVar11;
  msg_38.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_6e0,
             msg_38);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,*(undefined **)uVar3,
             *(undefined **)(uVar3 + 8) + (long)*(undefined **)uVar3);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf98108;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013d42f0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_178,1,2,REQUIRE,0xf9ee47,(size_t)&local_c0,0x589,
             local_58,"\"\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_6f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_6e8 = "";
  local_700 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_39.m_end = (iterator)0x58a;
  file_39.m_begin = (iterator)&local_6f0;
  msg_39.m_end = pvVar11;
  msg_39.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_700,
             msg_39);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,*(undefined **)(uVar3 + 0x10),
             *(undefined **)(uVar3 + 0x18) + (long)*(undefined **)(uVar3 + 0x10));
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"foo");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf98108;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "foo";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013d44b0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_178,1,2,REQUIRE,0xf9ee5d,(size_t)&local_c0,0x58a,
             local_58,"\"foo\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_710 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_708 = "";
  local_720 = &boost::unit_test::basic_cstring<char_const>::null;
  local_718 = &boost::unit_test::basic_cstring<char_const>::null;
  file_40.m_end = (iterator)0x58b;
  file_40.m_begin = (iterator)&local_710;
  msg_40.m_end = pvVar11;
  msg_40.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_720,
             msg_40);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,*(undefined **)(uVar3 + 0x20),
             *(undefined **)(uVar3 + 0x28) + (long)*(undefined **)(uVar3 + 0x20));
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"bar");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf98108;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "bar";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013d44b0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_178,1,2,REQUIRE,0xf9ee73,(size_t)&local_c0,0x58b,
             local_58,"\"bar\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_730 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_728 = "";
  local_740 = &boost::unit_test::basic_cstring<char_const>::null;
  local_738 = &boost::unit_test::basic_cstring<char_const>::null;
  file_41.m_end = (iterator)0x58c;
  file_41.m_begin = (iterator)&local_730;
  msg_41.m_end = pvVar11;
  msg_41.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)&local_740,
             msg_41);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,*(undefined **)(uVar3 + 0x30),
             *(undefined **)(uVar3 + 0x38) + (long)*(undefined **)(uVar3 + 0x30));
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf98108;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013d42f0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_178,1,2,REQUIRE,0xf9ee89,(size_t)&local_c0,0x58c,
             local_58,"\"\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  operator_delete((void *)uVar3,uVar6 - uVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)input._M_dataplus._M_p != &input.field_2) {
    operator_delete(input._M_dataplus._M_p,
                    CONCAT71(input.field_2._M_allocated_capacity._1_7_,input.field_2._M_local_buf[0]
                            ) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_script_parsing)
{
    using namespace script;
    std::string input;
    Span<const char> sp;
    bool success;

    // Const(...): parse a constant, update span to skip it if successful
    input = "MilkToastHoney";
    sp = input;
    success = Const("", sp); // empty
    BOOST_CHECK(success);
    BOOST_CHECK_EQUAL(SpanToStr(sp), "MilkToastHoney");

    success = Const("Milk", sp);
    BOOST_CHECK(success);
    BOOST_CHECK_EQUAL(SpanToStr(sp), "ToastHoney");

    success = Const("Bread", sp);
    BOOST_CHECK(!success);

    success = Const("Toast", sp);
    BOOST_CHECK(success);
    BOOST_CHECK_EQUAL(SpanToStr(sp), "Honey");

    success = Const("Honeybadger", sp);
    BOOST_CHECK(!success);

    success = Const("Honey", sp);
    BOOST_CHECK(success);
    BOOST_CHECK_EQUAL(SpanToStr(sp), "");

    // Func(...): parse a function call, update span to argument if successful
    input = "Foo(Bar(xy,z()))";
    sp = input;

    success = Func("FooBar", sp);
    BOOST_CHECK(!success);

    success = Func("Foo(", sp);
    BOOST_CHECK(!success);

    success = Func("Foo", sp);
    BOOST_CHECK(success);
    BOOST_CHECK_EQUAL(SpanToStr(sp), "Bar(xy,z())");

    success = Func("Bar", sp);
    BOOST_CHECK(success);
    BOOST_CHECK_EQUAL(SpanToStr(sp), "xy,z()");

    success = Func("xy", sp);
    BOOST_CHECK(!success);

    // Expr(...): return expression that span begins with, update span to skip it
    Span<const char> result;

    input = "(n*(n-1))/2";
    sp = input;
    result = Expr(sp);
    BOOST_CHECK_EQUAL(SpanToStr(result), "(n*(n-1))/2");
    BOOST_CHECK_EQUAL(SpanToStr(sp), "");

    input = "foo,bar";
    sp = input;
    result = Expr(sp);
    BOOST_CHECK_EQUAL(SpanToStr(result), "foo");
    BOOST_CHECK_EQUAL(SpanToStr(sp), ",bar");

    input = "(aaaaa,bbbbb()),c";
    sp = input;
    result = Expr(sp);
    BOOST_CHECK_EQUAL(SpanToStr(result), "(aaaaa,bbbbb())");
    BOOST_CHECK_EQUAL(SpanToStr(sp), ",c");

    input = "xyz)foo";
    sp = input;
    result = Expr(sp);
    BOOST_CHECK_EQUAL(SpanToStr(result), "xyz");
    BOOST_CHECK_EQUAL(SpanToStr(sp), ")foo");

    input = "((a),(b),(c)),xxx";
    sp = input;
    result = Expr(sp);
    BOOST_CHECK_EQUAL(SpanToStr(result), "((a),(b),(c))");
    BOOST_CHECK_EQUAL(SpanToStr(sp), ",xxx");

    // Split(...): split a string on every instance of sep, return vector
    std::vector<Span<const char>> results;

    input = "xxx";
    results = Split(input, 'x');
    BOOST_CHECK_EQUAL(results.size(), 4U);
    BOOST_CHECK_EQUAL(SpanToStr(results[0]), "");
    BOOST_CHECK_EQUAL(SpanToStr(results[1]), "");
    BOOST_CHECK_EQUAL(SpanToStr(results[2]), "");
    BOOST_CHECK_EQUAL(SpanToStr(results[3]), "");

    input = "one#two#three";
    results = Split(input, '-');
    BOOST_CHECK_EQUAL(results.size(), 1U);
    BOOST_CHECK_EQUAL(SpanToStr(results[0]), "one#two#three");

    input = "one#two#three";
    results = Split(input, '#');
    BOOST_CHECK_EQUAL(results.size(), 3U);
    BOOST_CHECK_EQUAL(SpanToStr(results[0]), "one");
    BOOST_CHECK_EQUAL(SpanToStr(results[1]), "two");
    BOOST_CHECK_EQUAL(SpanToStr(results[2]), "three");

    input = "*foo*bar*";
    results = Split(input, '*');
    BOOST_CHECK_EQUAL(results.size(), 4U);
    BOOST_CHECK_EQUAL(SpanToStr(results[0]), "");
    BOOST_CHECK_EQUAL(SpanToStr(results[1]), "foo");
    BOOST_CHECK_EQUAL(SpanToStr(results[2]), "bar");
    BOOST_CHECK_EQUAL(SpanToStr(results[3]), "");
}